

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O2

void __thiscall
duckdb::ART::InsertIntoEmpty
          (ART *this,Node *node,ARTKey *key,idx_t depth,ARTKey *row_id,GateStatus status)

{
  ulong uVar1;
  undefined3 in_register_00000089;
  reference<Node> ref;
  reference<Node> local_18;
  
  if (CONCAT31(in_register_00000089,status) == 1) {
    uVar1 = *(ulong *)row_id->data & 0xfffffffffffffff8 ^ 0x87;
    (node->super_IndexPointer).data =
         *(ulong *)row_id->data >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
         (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8
         | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  }
  else {
    local_18._M_data = node;
    Prefix::New(this,&local_18,key,depth,key->len - depth);
    uVar1 = *(ulong *)row_id->data & 0xfffffffffffffff8 ^ 0x87;
    ((local_18._M_data)->super_IndexPointer).data =
         *(ulong *)row_id->data >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
         (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8
         | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  }
  return;
}

Assistant:

void ART::InsertIntoEmpty(Node &node, const ARTKey &key, const idx_t depth, const ARTKey &row_id,
                          const GateStatus status) {
	D_ASSERT(depth <= key.len);
	D_ASSERT(!node.HasMetadata());

	if (status == GateStatus::GATE_SET) {
		Leaf::New(node, row_id.GetRowId());
		return;
	}

	reference<Node> ref(node);
	auto count = key.len - depth;

	Prefix::New(*this, ref, key, depth, count);
	Leaf::New(ref, row_id.GetRowId());
}